

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O1

int notation4(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  code *pcVar1;
  
  if (tok == 0xf) {
    return 0x11;
  }
  if (tok == 0x11) {
    pcVar1 = internalSubset;
    if (state->documentEntity == 0) {
      pcVar1 = externalSubset1;
    }
    state->handler = pcVar1;
    return 0x14;
  }
  if (tok == 0x1b) {
    state->handler = declClose;
    state->role_none = 0x11;
    return 0x13;
  }
  if ((tok == 0x1c) && (state->documentEntity == 0)) {
    return 0x3b;
  }
  state->handler = error;
  return -1;
}

Assistant:

static int PTRCALL
notation4(PROLOG_STATE *state, int tok, const char *ptr, const char *end,
          const ENCODING *enc) {
  UNUSED_P(ptr);
  UNUSED_P(end);
  UNUSED_P(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NOTATION_NONE;
  case XML_TOK_LITERAL:
    state->handler = declClose;
    state->role_none = XML_ROLE_NOTATION_NONE;
    return XML_ROLE_NOTATION_SYSTEM_ID;
  case XML_TOK_DECL_CLOSE:
    setTopLevel(state);
    return XML_ROLE_NOTATION_NO_SYSTEM_ID;
  }
  return common(state, tok);
}